

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_dnscache_add(Curl_easy *data,Curl_dns_entry *entry)

{
  Curl_hash *h;
  size_t sVar1;
  void *pvVar2;
  size_t in_R8;
  CURLcode CVar3;
  char id [262];
  
  h = &dnscache_get(data)->entries;
  if (h == (Curl_hash *)0x0) {
    CVar3 = CURLE_FAILED_INIT;
  }
  else {
    CVar3 = CURLE_OK;
    sVar1 = create_dnscache_id(entry->hostname,0,entry->hostport,id,in_R8);
    dnscache_lock(data,(Curl_dnscache *)h);
    pvVar2 = Curl_hash_add(h,id,sVar1 + 1,entry);
    if (pvVar2 == (void *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      entry->refcount = entry->refcount + 1;
    }
    dnscache_unlock(data,(Curl_dnscache *)h);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_dnscache_add(struct Curl_easy *data,
                           struct Curl_dns_entry *entry)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  char id[MAX_HOSTCACHE_LEN];
  size_t idlen;

  if(!dnscache)
    return CURLE_FAILED_INIT;
  /* Create an entry id, based upon the hostname and port */
  idlen = create_dnscache_id(entry->hostname, 0, entry->hostport,
                             id, sizeof(id));

  /* Store the resolved data in our DNS cache and up ref count */
  dnscache_lock(data, dnscache);
  if(!Curl_hash_add(&dnscache->entries, id, idlen + 1, (void *)entry)) {
    dnscache_unlock(data, dnscache);
    return CURLE_OUT_OF_MEMORY;
  }
  entry->refcount++;
  dnscache_unlock(data, dnscache);
  return CURLE_OK;
}